

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::BaseRockSample::PrintBelief(BaseRockSample *this,Belief *belief,ostream *out)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int rock;
  ulong uVar9;
  int rock_1;
  long lVar10;
  int i;
  double dVar11;
  vector<double,_std::allocator<double>_> pos_probs;
  vector<double,_std::allocator<double>_> rock_probs;
  undefined8 local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  plVar4 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)this->num_rocks_,
             (allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (ulong)(uint)(this->size_ * this->size_),(allocator_type *)&local_68);
  lVar10 = *plVar4;
  lVar2 = plVar4[1];
  uVar1 = this->num_rocks_;
  lVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; lVar6 != lVar2 - lVar10 >> 3; lVar6 = lVar6 + 1) {
    lVar3 = *(long *)(lVar10 + lVar6 * 8);
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      dVar11 = 1.0;
      if ((*(uint *)(lVar3 + 0xc) >> ((uint)uVar9 & 0x1f) & 1) == 0) {
        dVar11 = 0.0;
      }
      local_48._M_impl.super__Vector_impl_data._M_start[uVar9] =
           dVar11 * *(double *)(lVar3 + 0x18) +
           local_48._M_impl.super__Vector_impl_data._M_start[uVar9];
    }
    iVar8 = *(int *)(lVar3 + 0xc) >> ((byte)uVar1 & 0x1f);
    local_60._M_impl.super__Vector_impl_data._M_start[iVar8] =
         *(double *)(lVar3 + 0x18) + local_60._M_impl.super__Vector_impl_data._M_start[iVar8];
  }
  std::operator<<(out,"Rock belief:");
  for (lVar10 = 0; lVar10 < this->num_rocks_; lVar10 = lVar10 + 1) {
    std::operator<<(out," ");
    std::ostream::_M_insert<double>(local_48._M_impl.super__Vector_impl_data._M_start[lVar10]);
  }
  std::endl<char,std::char_traits<char>>(out);
  std::operator<<(out,"Position belief:");
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar7 = uVar7 + 1) {
    if (0.0 < local_60._M_impl.super__Vector_impl_data._M_start[uVar7]) {
      poVar5 = std::operator<<(out," ");
      local_68 = IndexToCoord(this,(int)uVar7);
      poVar5 = (ostream *)despot::operator<<(poVar5,(Coord *)&local_68);
      std::operator<<(poVar5,":");
      std::ostream::_M_insert<double>(local_60._M_impl.super__Vector_impl_data._M_start[uVar7]);
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void BaseRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	vector<double> rock_probs(num_rocks_);
	vector<double> pos_probs(size_ * size_);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		for (int rock = 0; rock < num_rocks_; rock++)
			rock_probs[rock] += CheckFlag(particle->state_id, rock)
				* particle->weight;
		pos_probs[particle->state_id >> num_rocks_] += particle->weight;
	}

	out << "Rock belief:";
	for (int rock = 0; rock < num_rocks_; rock++)
		out << " " << rock_probs[rock];
	out << endl;

	out << "Position belief:";
	for (int i = 0; i < pos_probs.size(); i++) {
		if (pos_probs[i] > 0)
			out << " " << IndexToCoord(i) << ":" << pos_probs[i];
	}
	out << endl;
}